

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_advanced.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char buffer [12];
  
  builtin_strncpy(buffer,"Hello Mraa!",0xc);
  signal(2,sig_handler);
  mraa_init();
  lVar2 = mraa_uart_init_raw(dev_path);
  if (lVar2 == 0) {
    fwrite("Failed to initialize UART\n",0x1a,1,_stderr);
  }
  else {
    iVar1 = mraa_uart_set_baudrate(lVar2,0x2580);
    if (((iVar1 == 0) && (iVar1 = mraa_uart_set_mode(lVar2,8,0,1), iVar1 == 0)) &&
       (iVar1 = mraa_uart_set_flowcontrol(lVar2,0,0), iVar1 == 0)) {
      while (flag != 0) {
        mraa_uart_write(lVar2,buffer,0xc);
        sleep(1);
      }
      mraa_uart_stop(lVar2);
      mraa_deinit();
      return 0;
    }
    mraa_result_print(iVar1);
    mraa_uart_stop(lVar2);
    mraa_deinit();
  }
  return 1;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_uart_context uart;
    char buffer[] = "Hello Mraa!";

    int baudrate = 9600, stopbits = 1, databits = 8;
    mraa_uart_parity_t parity = MRAA_UART_PARITY_NONE;
    unsigned int ctsrts = FALSE, xonxoff = FALSE;

    /* install signal handler */
    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the time) */
    mraa_init();

    //! [Interesting]
    /* initialize uart */
    uart = mraa_uart_init_raw(dev_path);
    if (uart == NULL) {
        fprintf(stderr, "Failed to initialize UART\n");
        return EXIT_FAILURE;
    }

    /* set serial port parameters */
    status = mraa_uart_set_baudrate(uart, baudrate);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }
    status = mraa_uart_set_mode(uart, databits, parity, stopbits);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }
    status = mraa_uart_set_flowcontrol(uart, xonxoff, ctsrts);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    while (flag) {
        /* send data through uart */
        mraa_uart_write(uart, buffer, sizeof(buffer));

        sleep(1);
    }

    /* stop uart */
    mraa_uart_stop(uart);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the time) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* stop uart */
    mraa_uart_stop(uart);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}